

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distribution.cpp
# Opt level: O0

void __thiscall Distribution::Distribution(Distribution *this)

{
  result_type_conflict rVar1;
  uniform_real_distribution<double> local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2730;
  undefined1 local_13a8 [8];
  random_device rd;
  Distribution *this_local;
  
  this->_vptr_Distribution = (_func_int **)&PTR___cxa_pure_virtual_0011fcf8;
  std::random_device::random_device(&this->rd);
  std::uniform_real_distribution<double>::uniform_real_distribution(&this->distrib);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->gen);
  std::random_device::random_device((random_device *)local_13a8);
  rVar1 = std::random_device::operator()((random_device *)local_13a8);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_2730,(ulong)rVar1);
  memcpy(&this->gen,&local_2730,5000);
  std::uniform_real_distribution<double>::uniform_real_distribution(&local_2740,0.0,1.0);
  (this->distrib)._M_param._M_a = local_2740._M_param._M_a;
  (this->distrib)._M_param._M_b = local_2740._M_param._M_b;
  std::random_device::~random_device((random_device *)local_13a8);
  return;
}

Assistant:

Distribution::Distribution() {
	std::random_device rd;		//Will be used to obtain a seed for the random number engine
	gen = std::mt19937 (rd());	//Standard mersenne_twister_engine seeded with rd()
	distrib = std::uniform_real_distribution<> (0,1);
}